

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::WeightParams::_InternalSerialize
          (WeightParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  QuantizationParams *this_00;
  ulong uVar4;
  LogMessage *other;
  uint uVar5;
  uint uVar6;
  string *psVar7;
  uint size;
  size_t sVar8;
  byte *ptr;
  byte *pbVar9;
  undefined8 *puVar10;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (0 < (this->floatvalue_).current_size_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar2 = (this->floatvalue_).current_size_;
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    size = iVar2 << 2;
    *target = 10;
    pbVar9 = target + 1;
    uVar6 = size;
    uVar5 = size;
    if (0x7f < size) {
      do {
        target = pbVar9;
        *target = (byte)uVar5 | 0x80;
        uVar6 = uVar5 >> 7;
        pbVar9 = target + 1;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar6;
      } while (bVar1);
    }
    ptr = target + 2;
    *pbVar9 = (byte)uVar6;
    pvVar3 = (this->floatvalue_).arena_or_elements_;
    sVar8 = (size_t)(int)size;
    if ((long)stream->end_ - (long)ptr < (long)sVar8) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,pvVar3,size,ptr);
    }
    else {
      memcpy(ptr,pvVar3,sVar8);
      target = ptr + sVar8;
    }
  }
  psVar7 = (string *)((ulong)(this->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar7->_M_string_length != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,psVar7,target);
  }
  psVar7 = (string *)((ulong)(this->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar7->_M_string_length != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x1e,psVar7,target);
  }
  psVar7 = (string *)((ulong)(this->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (psVar7->_M_string_length != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x1f,psVar7,target);
  }
  if ((this != (WeightParams *)_WeightParams_default_instance_) &&
     (this->quantization_ != (QuantizationParams *)0x0)) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->quantization_;
    target[0] = 0xc2;
    target[1] = 2;
    uVar6 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (byte)uVar6;
    if (uVar6 < 0x80) {
      pbVar9 = target + 3;
    }
    else {
      pbVar9 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar6,target + 2);
    }
    target = QuantizationParams::_InternalSerialize(this_00,pbVar9,stream);
  }
  if (this->isupdatable_ == true) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->isupdatable_;
    target[0] = 0x90;
    target[1] = 3;
    target[2] = bVar1;
    target = target + 3;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    pvVar3 = *(void **)((uVar4 & 0xfffffffffffffffc) + 8);
    uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar4 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)((uVar4 & 0xfffffffffffffffc) + 8);
    }
    sVar8 = (size_t)(int)puVar10[1];
    if ((long)stream->end_ - (long)target < (long)sVar8) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar3,(int)puVar10[1],target);
    }
    else {
      memcpy(target,pvVar3,sVar8);
      target = target + sVar8;
    }
  }
  return target;
}

Assistant:

uint8_t* WeightParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.WeightParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float floatValue = 1;
  if (this->_internal_floatvalue_size() > 0) {
    target = stream->WriteFixedPacked(1, _internal_floatvalue(), target);
  }

  // bytes float16Value = 2;
  if (!this->_internal_float16value().empty()) {
    target = stream->WriteBytesMaybeAliased(
        2, this->_internal_float16value(), target);
  }

  // bytes rawValue = 30;
  if (!this->_internal_rawvalue().empty()) {
    target = stream->WriteBytesMaybeAliased(
        30, this->_internal_rawvalue(), target);
  }

  // bytes int8RawValue = 31;
  if (!this->_internal_int8rawvalue().empty()) {
    target = stream->WriteBytesMaybeAliased(
        31, this->_internal_int8rawvalue(), target);
  }

  // .CoreML.Specification.QuantizationParams quantization = 40;
  if (this->_internal_has_quantization()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        40, _Internal::quantization(this), target, stream);
  }

  // bool isUpdatable = 50;
  if (this->_internal_isupdatable() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(50, this->_internal_isupdatable(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.WeightParams)
  return target;
}